

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::handleIf(Executor *this,FunctionCallNode *node)

{
  element_type *peVar1;
  pointer pVVar2;
  TypeName *pTVar3;
  double *pdVar4;
  long *in_RSI;
  undefined8 in_RDI;
  double condition;
  NumberValueAnalyser analyser;
  const_iterator it;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *args;
  Node *in_stack_00000128;
  string *in_stack_00000130;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *in_stack_ffffffffffffff28;
  NumberValueAnalyser *in_stack_ffffffffffffff30;
  _List_const_iterator<std::shared_ptr<ExpressionNode>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  ValueVisitor in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  _List_const_iterator<std::shared_ptr<ExpressionNode>_> local_20;
  undefined8 local_18;
  
  local_18 = (**(code **)(*in_RSI + 0x18))();
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
       begin(in_stack_ffffffffffffff28);
  std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
            ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)in_stack_ffffffffffffff30);
  peVar1 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15b044);
  (*(peVar1->super_Node)._vptr_Node[2])(peVar1,in_RDI);
  pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x15b060);
  pTVar3 = Value::getType(pVVar2);
  if (*pTVar3 != F32) {
    pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                       ((unique_ptr<Value,_std::default_delete<Value>_> *)0x15b07f);
    Value::getType(pVVar2);
    std::
    unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
    std::operator+(in_stack_ffffffffffffff78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff70._vptr_ValueVisitor);
    std::operator+(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    reportError(in_stack_00000130,in_stack_00000128);
  }
  NumberValueAnalyser::NumberValueAnalyser(in_stack_ffffffffffffff30);
  pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x15b138);
  (*pVVar2->_vptr_Value[3])();
  NumberValueAnalyser::getValue((NumberValueAnalyser *)&stack0xffffffffffffff70);
  pdVar4 = std::optional<double>::value((optional<double> *)in_stack_ffffffffffffff30);
  if (ABS(*pdVar4) <= 0.0001) {
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::back
              ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)in_stack_ffffffffffffff30);
    peVar1 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15b20a);
    (*(peVar1->super_Node)._vptr_Node[2])(peVar1,in_RDI);
  }
  else {
    this_00 = &local_20;
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(this_00,0);
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*(this_00);
    peVar1 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15b1c6);
    (*(peVar1->super_Node)._vptr_Node[2])(peVar1,in_RDI);
  }
  NumberValueAnalyser::~NumberValueAnalyser((NumberValueAnalyser *)0x15b229);
  return;
}

Assistant:

void Executor::handleIf(const FunctionCallNode& node)
{
  const auto& args = node.getArguments();
  auto it = args.begin();
  (*it)->accept(*this);

  if(value_->getType() != TypeName::F32)
    reportError("Function if expected logical expression, but got " +
                TypeNameStrings.at(value_->getType()) + "!", node);

  NumberValueAnalyser analyser{};
  value_->accept(analyser);
  const auto condition = analyser.getValue().value();

  if(std::fabs(condition) > 0.0001)
  {
    it++;
    (*it)->accept(*this);
  }
  else
  {
    args.back()->accept(*this);
  }
}